

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

string * deqp::gls::ShaderExecUtil::generatePassthroughFragmentShader
                   (string *__return_storage_ptr__,ShaderSpec *shaderSpec,bool useIntOutputs,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *outLocationMap,string *inputPrefix,string *outputPrefix)

{
  pointer __rhs;
  int vecSize;
  DataType DVar1;
  char *pcVar2;
  ostream *poVar3;
  VarType *varType_;
  VarType intType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  DeclareVariable local_1e8;
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(shaderSpec->version);
  poVar3 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  std::operator<<(poVar3,"\n");
  if ((shaderSpec->globalDeclarations)._M_string_length != 0) {
    poVar3 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,
                             (string *)&shaderSpec->globalDeclarations);
    std::operator<<(poVar3,"\n");
  }
  for (varType_ = &((shaderSpec->outputs).
                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                    ._M_impl.super__Vector_impl_data._M_start)->varType;
      __rhs = (pointer)((long)&varType_[-2].m_data + 8),
      __rhs != (shaderSpec->outputs).
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish; varType_ = (VarType *)&varType_[2].m_data
      ) {
    DVar1 = (varType_->m_data).basic.type;
    if (DVar1 - TYPE_BOOL < 4) {
      vecSize = glu::getDataTypeScalarSize(DVar1);
      DVar1 = TYPE_INT;
      if (1 < vecSize) {
        DVar1 = glu::getDataTypeIntVec(vecSize);
      }
      glu::VarType::VarType(&intType,DVar1,PRECISION_HIGHP);
      poVar3 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"flat in ");
      std::operator+(&local_208,inputPrefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      glu::decl::DeclareVariable::DeclareVariable(&local_1e8,&intType,&local_208,0);
      poVar3 = glu::decl::operator<<(poVar3,&local_1e8);
      std::operator<<(poVar3,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      glu::VarType::~VarType(&intType);
    }
    else {
      poVar3 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"flat in ");
      std::operator+(&local_208,inputPrefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      glu::decl::DeclareVariable::DeclareVariable(&local_1e8,varType_,&local_208,0);
      poVar3 = glu::decl::operator<<(poVar3,&local_1e8);
      std::operator<<(poVar3,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
    }
  }
  generateFragShaderOutputDecl
            (&src.super_basic_ostream<char,_std::char_traits<char>_>,shaderSpec,useIntOutputs,
             outLocationMap,outputPrefix);
  std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"\nvoid main (void)\n{\n")
  ;
  generateFragShaderOutAssign
            (&src.super_basic_ostream<char,_std::char_traits<char>_>,shaderSpec,useIntOutputs,
             inputPrefix,outputPrefix);
  std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return __return_storage_ptr__;
}

Assistant:

static std::string generatePassthroughFragmentShader (const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& inputPrefix, const std::string& outputPrefix)
{
	DE_ASSERT(glu::glslVersionUsesInOutQualifiers(shaderSpec.version));

	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
	{
		if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType		intType		(intBaseType, glu::PRECISION_HIGHP);

			src << "flat in " << glu::declare(intType, inputPrefix + output->name) << ";\n";
		}
		else
			src << "flat in " << glu::declare(output->varType, inputPrefix + output->name) << ";\n";
	}

	generateFragShaderOutputDecl(src, shaderSpec, useIntOutputs, outLocationMap, outputPrefix);

	src << "\nvoid main (void)\n{\n";

	generateFragShaderOutAssign(src, shaderSpec, useIntOutputs, inputPrefix, outputPrefix);

	src << "}\n";

	return src.str();
}